

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86PUSH(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  x86Reg local_20;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  if (size != sDWORD && size != sQWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x2bf,"int x86PUSH(unsigned char *, x86Size, x86Reg, int, x86Reg, int)");
  }
  local_20 = base;
  base_local = index;
  if (((base == rNONE) && (index != rNONE)) && (multiplier == 1)) {
    base_local = rNONE;
    local_20 = index;
  }
  uVar1 = encodeRex(stream,false,rNONE,base_local,local_20);
  puVar2 = stream + uVar1;
  *puVar2 = 0xff;
  uVar1 = encodeAddress(puVar2 + 1,base_local,multiplier,local_20,shift,6);
  return ((int)(puVar2 + 1) + uVar1) - (int)stream;
}

Assistant:

int x86PUSH(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);
	(void)size;

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	stream += encodeRex(stream, false, rNONE, index, base);
	*stream++ = 0xff;
	stream += encodeAddress(stream, index, multiplier, base, shift, 6);

	return int(stream - start);
}